

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O0

uint __thiscall Imf_2_5::TimeCode::timeAndFlags(TimeCode *this,Packing packing)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int in_ESI;
  uint *in_RDI;
  uint t;
  undefined4 local_4;
  
  if (in_ESI == 1) {
    uVar1 = *in_RDI;
    bVar2 = bgf0((TimeCode *)0x7cdf5f);
    bVar3 = bgf2((TimeCode *)0x7cdf79);
    bVar4 = bgf1((TimeCode *)0x7cdf93);
    bVar5 = fieldPhase((TimeCode *)0x7cdfad);
    local_4 = (uint)bVar5 << 0x1f |
              (uint)bVar4 << 0x1e | (uint)bVar3 << 0x17 | (uint)bVar2 << 0xf | uVar1 & 0x3f7f7fbf;
  }
  else if (in_ESI == 2) {
    local_4 = *in_RDI & 0xffffff3f;
  }
  else {
    local_4 = *in_RDI;
  }
  return local_4;
}

Assistant:

unsigned int
TimeCode::timeAndFlags (Packing packing) const
{
    if (packing == TV50_PACKING)
    {
	unsigned int t = _time;

	t &= ~((1 << 6) | (1 << 15) | (1 << 23) | (1 << 30) | (1 << 31));

	t |= ((unsigned int) bgf0() << 15);
	t |= ((unsigned int) bgf2() << 23);
	t |= ((unsigned int) bgf1() << 30);
	t |= ((unsigned int) fieldPhase() << 31);

	return t;
    }
    if (packing == FILM24_PACKING)
    {
	return _time & ~((1 << 6) | (1 << 7));
    }
    else // packing == TV60_PACKING
    {
	return _time;
    }
}